

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt,int qualified)

{
  bool bVar1;
  uint val;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  long lVar6;
  uint uVar7;
  uint len;
  int l;
  xmlChar buf [105];
  int local_b0;
  int local_ac;
  xmlChar local_a8 [120];
  
  val = xmlXPathCurrentChar(ctxt,&local_b0);
  if ((val - 0x20 < 0x3e) && ((0x2800000140008401U >> ((ulong)(val - 0x20) & 0x3f) & 1) != 0)) {
    return (xmlChar *)0x0;
  }
  if (val < 0x100) {
    if ((val - 0xc0 < 0x17 || (val & 0xdf) - 0x41 < 0x1a) || (0xf7 < val || val - 0xd8 < 0x1f))
    goto LAB_001c35d2;
  }
  else {
    iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
    if (iVar2 != 0) goto LAB_001c35d2;
  }
  if (val < 0x100) {
    if (val == 0x5f) goto LAB_001c35d2;
  }
  else if ((0xfffffff6 < val - 0x302a || 0xffffae59 < val - 0x9fa6) || val == 0x3007)
  goto LAB_001c35d2;
  if (val != 0x3a || qualified == 0) {
    return (xmlChar *)0x0;
  }
LAB_001c35d2:
  len = 0;
  local_ac = qualified;
  do {
    if ((val < 0x3f) && ((0x4000800100000000U >> ((ulong)val & 0x3f) & 1) != 0)) goto LAB_001c376c;
    if (val < 0x100) {
      if ((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) && (val < 0xf8 && 0x1e < val - 0xd8)) {
LAB_001c3661:
        if (val < 0x100) {
          if (9 < val - 0x30) {
LAB_001c36b4:
            if (((0x32 < val - 0x2d) ||
                ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0)) &&
               (local_ac == 0 || val != 0x3a)) {
              if (val < 0x100) {
                uVar7 = (uint)(val == 0xb7);
              }
              else {
                iVar2 = xmlCharInRange(val,&xmlIsCombiningGroup);
                if (iVar2 != 0) goto LAB_001c36cd;
                uVar7 = xmlCharInRange(val,&xmlIsExtenderGroup);
              }
              if (uVar7 == 0) {
LAB_001c376c:
                if (len == 0) {
                  return (xmlChar *)0x0;
                }
                pxVar4 = xmlStrndup(local_a8,len);
                if (pxVar4 == (xmlChar *)0x0) {
                  xmlXPathPErrMemory(ctxt);
                  return (xmlChar *)0x0;
                }
                return pxVar4;
              }
            }
          }
        }
        else if (((8 < val - 0x3021 && 0x51a5 < val - 0x4e00) && val != 0x3007) &&
                (iVar2 = xmlCharInRange(val,&xmlIsDigitGroup), iVar2 == 0)) goto LAB_001c36b4;
      }
    }
    else {
      iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
      if (iVar2 == 0) goto LAB_001c3661;
    }
LAB_001c36cd:
    if (val < 0x80) {
      local_a8[(int)len] = (xmlChar)val;
      len = len + 1;
    }
    else {
      iVar2 = xmlCopyCharMultiByte(local_a8 + (int)len,val);
      len = len + iVar2;
    }
    ctxt->cur = ctxt->cur + local_b0;
    val = xmlXPathCurrentChar(ctxt,&local_b0);
  } while ((int)len < 100);
  if ((int)len < 0xc351) {
    iVar2 = len * 2;
    pxVar4 = (xmlChar *)(*xmlMalloc)((size_t)iVar2);
    if (pxVar4 != (xmlChar *)0x0) {
      memcpy(pxVar4,local_a8,(ulong)len);
      do {
        if (val < 0x100) {
          if ((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) && (val < 0xf8 && 0x1e < val - 0xd8)
             ) {
LAB_001c38a7:
            if (val < 0x100) {
              if (9 < val - 0x30) {
LAB_001c38fa:
                if (((0x32 < val - 0x2d) ||
                    ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0)) &&
                   (local_ac == 0 || val != 0x3a)) {
                  if (val < 0x100) {
                    uVar7 = (uint)(val == 0xb7);
                  }
                  else {
                    iVar3 = xmlCharInRange(val,&xmlIsCombiningGroup);
                    if (iVar3 != 0) goto LAB_001c391b;
                    uVar7 = xmlCharInRange(val,&xmlIsExtenderGroup);
                  }
                  if (uVar7 == 0) {
                    pxVar4[(int)len] = '\0';
                    return pxVar4;
                  }
                }
              }
            }
            else if (((8 < val - 0x3021 && 0x51a5 < val - 0x4e00) && val != 0x3007) &&
                    (iVar3 = xmlCharInRange(val,&xmlIsDigitGroup), iVar3 == 0)) goto LAB_001c38fa;
          }
        }
        else {
          iVar3 = xmlCharInRange(val,&xmlIsBaseCharGroup);
          if (iVar3 == 0) goto LAB_001c38a7;
        }
LAB_001c391b:
        if (iVar2 < (int)(len + 10)) {
          iVar3 = 1;
          if ((0 < iVar2) && (iVar3 = -1, iVar2 < 50000)) {
            uVar7 = iVar2 + 1U >> 1;
            iVar3 = uVar7 + iVar2;
            if ((int)(50000 - uVar7) < iVar2) {
              iVar3 = 50000;
            }
          }
          if (iVar3 < 0) {
            (*xmlFree)(pxVar4);
            xmlXPathErr(ctxt,7);
LAB_001c39b0:
            bVar1 = false;
          }
          else {
            pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar4,(size_t)iVar3);
            if (pxVar5 == (xmlChar *)0x0) {
              (*xmlFree)(pxVar4);
              xmlXPathPErrMemory(ctxt);
              goto LAB_001c39b0;
            }
            bVar1 = true;
            pxVar4 = pxVar5;
            iVar2 = iVar3;
          }
          if (!bVar1) {
            return (xmlChar *)0x0;
          }
        }
        if (val < 0x80) {
          lVar6 = (long)(int)len;
          len = len + 1;
          pxVar4[lVar6] = (xmlChar)val;
        }
        else {
          iVar3 = xmlCopyCharMultiByte(pxVar4 + (int)len,val);
          len = iVar3 + len;
        }
        ctxt->cur = ctxt->cur + local_b0;
        val = xmlXPathCurrentChar(ctxt,&local_b0);
      } while( true );
    }
    xmlXPathPErrMemory(ctxt);
  }
  else {
    xmlXPathErr(ctxt,7);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt, int qualified) {
    xmlChar *ret;
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;

    /*
     * Handler for more complex cases
     */
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
        (c == '[') || (c == ']') || (c == '@') || /* accelerators */
        (c == '*') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         ((!qualified) || (c != ':')))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || ((qualified) && (c == ':')) ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	COPY_BUF(buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

            if (len > XML_MAX_NAME_LENGTH) {
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    buffer = xmlMalloc(max);
	    if (buffer == NULL) {
                xmlXPathPErrMemory(ctxt);
                return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while ((IS_LETTER(c)) || (IS_DIGIT(c)) || /* test bigname.xml */
		   (c == '.') || (c == '-') ||
		   (c == '_') || ((qualified) && (c == ':')) ||
		   (IS_COMBINING(c)) ||
		   (IS_EXTENDER(c))) {
		if (len + 10 > max) {
                    xmlChar *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(max, 1, 1, XML_MAX_NAME_LENGTH);
                    if (newSize < 0) {
                        xmlFree(buffer);
                        xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
                        return(NULL);
                    }
		    tmp = xmlRealloc(buffer, newSize);
		    if (tmp == NULL) {
                        xmlFree(buffer);
                        xmlXPathPErrMemory(ctxt);
                        return(NULL);
		    }
                    buffer = tmp;
		    max = newSize;
		}
		COPY_BUF(buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
	return(NULL);
    ret = xmlStrndup(buf, len);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    return(ret);
}